

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# split.cpp
# Opt level: O1

void __thiscall
SplitStringTest_single_word_Test<char32_t>::TestBody
          (SplitStringTest_single_word_Test<char32_t> *this)

{
  char *pcVar1;
  AssertionResult gtest_ar;
  vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
  split_result;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> single_word;
  long *local_60;
  int local_58 [2];
  internal local_50 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_48;
  container_type_conflict5 local_40;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> local_28;
  
  make_word<char32_t,std::__cxx11::u32string>(&local_28,8,L'\0');
  jessilib::
  split<std::vector,___gnu_cxx::__normal_iterator<const_char32_t_*,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,___gnu_cxx::__normal_iterator<const_char32_t_*,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_char32_t>
            (&local_40,
             (__normal_iterator<const_char32_t_*,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
              )local_28._M_dataplus._M_p,
             (__normal_iterator<const_char32_t_*,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
              )(local_28._M_dataplus._M_p + local_28._M_string_length),L'\0');
  local_60 = (long *)((long)local_40.
                            super__Vector_base<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_40.
                            super__Vector_base<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 5);
  local_58[0] = 1;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            (local_50,"split_result.size()","1",(unsigned_long *)&local_60,local_58);
  if (local_50[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_60);
    if (local_48 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_48->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/split.cpp"
               ,0xd3,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_58,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_58);
    if (local_60 != (long *)0x0) {
      (**(code **)(*local_60 + 8))();
    }
  }
  if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_48,local_48);
  }
  local_60 = (long *)(local_40.
                      super__Vector_base<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->_M_string_length;
  local_58[0] = 8;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            (local_50,"split_result[0].size()","8",(unsigned_long *)&local_60,local_58);
  if (local_50[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_60);
    if (local_48 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_48->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/split.cpp"
               ,0xd4,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_58,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_58);
    if (local_60 != (long *)0x0) {
      (**(code **)(*local_60 + 8))();
    }
  }
  if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_48,local_48);
  }
  std::
  vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
  ::~vector(&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
       *)local_28._M_dataplus._M_p != &local_28.field_2) {
    operator_delete(local_28._M_dataplus._M_p,local_28.field_2._M_allocated_capacity * 4 + 4);
  }
  return;
}

Assistant:

TYPED_TEST(SplitStringTest, single_word) {
	std::basic_string<TypeParam> single_word = make_word<TypeParam>();
	std::vector<decltype(single_word)> split_result = split(single_word, default_delim<TypeParam>);
	EXPECT_EQ(split_result.size(), 1);
	EXPECT_EQ(split_result[0].size(), 8);
}